

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relocations.cpp
# Opt level: O1

void ast::Relocations::relocate(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  byte bVar1;
  uint section;
  uint offset;
  long lVar2;
  pointer pcVar3;
  Location *pLVar4;
  long lVar5;
  string *psVar6;
  uint16_t uVar7;
  Value_type VVar8;
  uint uVar9;
  uint uVar10;
  iterator iVar11;
  byte bVar12;
  undefined8 *puVar13;
  _Alloc_hider _Var14;
  key_type local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar13 = list_abi_cxx11_;
  if ((undefined8 **)list_abi_cxx11_ != &list_abi_cxx11_) {
    do {
      lVar2 = puVar13[2];
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar2 + 0x28);
      if (*(long *)(lVar2 + 0x30) == 0) {
LAB_001250b8:
        section = *(uint *)(lVar2 + 0x10);
        offset = *(uint *)(lVar2 + 0x14);
        uVar7 = Sections::read16(section,offset);
        bVar1 = *(byte *)(lVar2 + 0x1c);
        lVar5 = *(long *)(lVar2 + 0x30);
        if (lVar5 == 0) {
          uVar9 = 0;
        }
        else {
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          pcVar3 = (__rhs->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>((string *)&local_150,pcVar3,pcVar3 + lVar5);
          iVar11 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)Symbols::table_abi_cxx11_,&local_150);
          if (iVar11.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>,_true>
              ._M_cur == (__node_type *)0x0) {
            uVar9 = (uint)((ulong)(DAT_0013da98 - Sections::table) >> 3);
          }
          else {
            uVar9 = *(uint *)(*(long *)((long)iVar11.
                                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>,_true>
                                              ._M_cur + 0x28) + 0x3c);
          }
          uVar9 = Sections::get_address(uVar9);
        }
        uVar9 = uVar9 + *(int *)(lVar2 + 0x48);
        if ((lVar5 != 0) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2)) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if (*(int *)(lVar2 + 0x20) == 2) {
          if ((uVar9 & 1) != 0) {
            pLVar4 = *(Location **)(lVar2 + 8);
            string_printf_abi_cxx11_
                      (&local_d0,"Target address is odd: %+d (0x%x)",(ulong)uVar9,(ulong)uVar9);
            warning_report(pLVar4,&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p);
            }
          }
          uVar10 = Sections::get_address(section);
          uVar9 = uVar9 - (uVar10 + offset);
          if ((int)uVar9 < 0) {
            pLVar4 = *(Location **)(lVar2 + 8);
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"Indicated address must be higher than current location",
                       "");
            error_report(pLVar4,&local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
            }
          }
          if (1 << ((char)*(undefined4 *)(lVar2 + 0x1c) + 1U & 0x1f) <= (int)uVar9) {
            pLVar4 = *(Location **)(lVar2 + 8);
            string_printf_abi_cxx11_
                      (&local_110,
                       "Interval between PC and target address: %+d (0x%x), isn\'t codable with %d bit"
                       ,(ulong)uVar9,(ulong)uVar9);
            error_report(pLVar4,&local_110);
            psVar6 = &local_110;
            _Var14._M_p = local_110._M_dataplus._M_p;
LAB_0012533e:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var14._M_p != &psVar6->field_2) {
              operator_delete(_Var14._M_p);
            }
          }
LAB_00125348:
          uVar9 = (int)uVar9 >> 1;
        }
        else {
          if (*(int *)(lVar2 + 0x20) == 1) {
            if ((uVar9 & 1) != 0) {
              pLVar4 = *(Location **)(lVar2 + 8);
              string_printf_abi_cxx11_
                        (&local_90,"Target address is odd: %+d (0x%x)",(ulong)uVar9,(ulong)uVar9);
              warning_report(pLVar4,&local_90);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p);
              }
            }
            uVar10 = Sections::get_address(section);
            bVar12 = (byte)*(int *)(lVar2 + 0x1c);
            uVar9 = uVar9 - (uVar10 + offset);
            if ((int)uVar9 < -1 << (bVar12 & 0x1f) || 1 << (bVar12 & 0x1f) <= (int)uVar9) {
              pLVar4 = *(Location **)(lVar2 + 8);
              string_printf_abi_cxx11_
                        (&local_b0,
                         "Interval between PC and target address: %+d (0x%x), isn\'t codable in %d bit two\'s complementxx"
                         ,(ulong)uVar9,(ulong)uVar9,(ulong)(*(int *)(lVar2 + 0x1c) + 1));
              error_report(pLVar4,&local_b0);
              psVar6 = &local_b0;
              _Var14._M_p = local_b0._M_dataplus._M_p;
              goto LAB_0012533e;
            }
            goto LAB_00125348;
          }
          if (1 << ((byte)*(undefined4 *)(lVar2 + 0x1c) & 0x1f) < (int)uVar9) {
            pLVar4 = *(Location **)(lVar2 + 8);
            string_printf_abi_cxx11_
                      (&local_130,"Expression\'s value: %d (0x%x) isn\'t codable in %d bit",
                       (ulong)uVar9,(ulong)uVar9);
            error_report(pLVar4,&local_130);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p);
            }
          }
        }
        uVar10 = ~(-1 << (bVar1 & 0x1f));
        Sections::write16(section,offset,
                          (ushort)((uVar9 & uVar10) << (*(byte *)(lVar2 + 0x18) & 0x1f)) |
                          uVar7 & ~(ushort)(uVar10 << (*(byte *)(lVar2 + 0x18) & 0x1f)));
      }
      else {
        pcVar3 = (__rhs->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar3,pcVar3 + *(long *)(lVar2 + 0x30));
        VVar8 = Symbols::get_type(&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (VVar8 != UNDEFINED) goto LAB_001250b8;
        pLVar4 = *(Location **)(lVar2 + 8);
        std::operator+(&local_50,"Undefined symbol: ",__rhs);
        error_report(pLVar4,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      puVar13 = (undefined8 *)*puVar13;
    } while ((undefined8 **)puVar13 != &list_abi_cxx11_);
  }
  return;
}

Assistant:

void Relocations::relocate()
{
	for (auto reloc: list) {
		if ( ! reloc->symbol.empty()) {
			if (Symbols::get_type(reloc->symbol) == UNDEFINED) {
				error_report(reloc->exp_location, "Undefined symbol: " + reloc->symbol);
				continue;
			}
		}
		auto section = reloc->section_index;
		auto offset = reloc->section_offset;
		auto content = Sections::read16(section, offset);
		auto mask = MAKE_MASK(reloc->width, 0U);
		//  Saltos para endereços absolutos geram relocations relativas sem simbolo associado
		auto value = 0;	// Valor com sinal
		value = (reloc->symbol.empty() ? 0 : Sections::get_address(Symbols::get_section(reloc->symbol)))
				+ reloc->addend;
		if (reloc->type == Relocation::Relocation_type::RELATIVE) {
			// Nas instruções branch os offsets são codificados em número de instruções (value / 2)
			if (value & 1)
				warning_report(reloc->exp_location,
					string_printf("Target address is odd: %+d (0x%x)", value, value));
			value -= Sections::get_address(section) + offset;
			if (value >= (1 << reloc->width) || value < (~0 << reloc->width))	// signed
				error_report(reloc->exp_location,
						 string_printf("Interval between PC and target address: %+d (0x%x), "
								"isn't codable in %d bit two's complementxx",
								value, value, reloc->width + 1));
			value >>= 1;
		}
		else if (reloc->type == Relocation::Relocation_type::RELATIVE_UNSIGNED) {	// usado no ldr rd, label
			if (value & 1)
				warning_report(reloc->exp_location,
					string_printf("Target address is odd: %+d (0x%x)", value, value));
			value -= Sections::get_address(section) + offset;
			if (value < 0)
				error_report(reloc->exp_location,
							"Indicated address must be higher than current location");
			if (value >= (1 << (reloc->width + 1)))
				error_report(reloc->exp_location,
					string_printf("Interval between PC and target address: %+d (0x%x), "
							"isn't codable with %d bit",
							value, value, reloc->width + 1));
			value >>= 1;
		}
		else if (value > (1 << reloc->width)) { // Relocation::Type::ABSOLUTE
			error_report(reloc->exp_location,
				string_printf("Expression's value: %d (0x%x) isn't codable in %d bit",
					value, value, reloc->width));
		}
		content &= ~(mask << reloc->position);
		content |= (value & mask) << reloc->position;
		Sections::write16(section, offset, content);
	}
}